

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strex.cc
# Opt level: O2

int do_buf(uchar *buf,int buflen,int encoding,unsigned_long flags,char *quotes,BIO *out)

{
  int reason;
  code *pcVar1;
  uint8_t *puVar2;
  size_t sVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  int iVar7;
  size_t i;
  size_t sVar8;
  bool bVar9;
  uint32_t c;
  uint8_t utf8_buf [6];
  CBS cbs;
  CBB utf8_cbb;
  
  uVar4 = encoding - 0x1000;
  if ((uVar4 < 5) && ((0x17U >> (encoding & 0x1fU) & 1) != 0)) {
    reason = *(int *)(&DAT_0028b9dc + (ulong)uVar4 * 4);
    pcVar1 = (code *)(&PTR_CBS_get_utf8_002fb6d0)[uVar4];
    cbs.len = (size_t)buflen;
    iVar7 = 0;
    cbs.data = buf;
    while( true ) {
      puVar2 = cbs.data;
      if (cbs.len == 0) {
        return iVar7;
      }
      bVar9 = cbs.data == buf;
      iVar5 = (*pcVar1)(&cbs);
      sVar3 = cbs.len;
      if (iVar5 == 0) break;
      if ((flags & 0x10) == 0) {
        iVar5 = do_esc_char(c,flags,quotes,out,(uint)bVar9,(uint)(cbs.len == 0));
        if (iVar5 < 0) {
          return -1;
        }
        iVar7 = iVar7 + iVar5;
      }
      else {
        CBB_init_fixed(&utf8_cbb,utf8_buf,6);
        iVar5 = CBB_add_utf8(&utf8_cbb,c);
        if (iVar5 == 0) {
          ERR_put_error(0xc,0,0x44,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_strex.cc"
                        ,0x87);
          return 1;
        }
        sVar6 = CBB_len(&utf8_cbb);
        for (sVar8 = 0; sVar6 != sVar8; sVar8 = sVar8 + 1) {
          iVar5 = do_esc_char((uint)utf8_buf[sVar8],flags,quotes,out,
                              (uint)(puVar2 == buf && sVar8 == 0),
                              (uint)(sVar6 - 1 == sVar8 && sVar3 == 0));
          if (iVar5 < 0) {
            return -1;
          }
          iVar7 = iVar7 + iVar5;
        }
      }
    }
    ERR_put_error(0xc,0,reason,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_strex.cc"
                  ,0x7e);
    return -1;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_strex.cc"
                ,0x73,"int do_buf(const unsigned char *, int, int, unsigned long, char *, BIO *)");
}

Assistant:

static int do_buf(const unsigned char *buf, int buflen, int encoding,
                  unsigned long flags, char *quotes, BIO *out) {
  int (*get_char)(CBS *cbs, uint32_t *out);
  int get_char_error;
  switch (encoding) {
    case MBSTRING_UNIV:
      get_char = CBS_get_utf32_be;
      get_char_error = ASN1_R_INVALID_UNIVERSALSTRING;
      break;
    case MBSTRING_BMP:
      get_char = CBS_get_ucs2_be;
      get_char_error = ASN1_R_INVALID_BMPSTRING;
      break;
    case MBSTRING_ASC:
      get_char = CBS_get_latin1;
      get_char_error = ERR_R_INTERNAL_ERROR;  // Should not be possible.
      break;
    case MBSTRING_UTF8:
      get_char = CBS_get_utf8;
      get_char_error = ASN1_R_INVALID_UTF8STRING;
      break;
    default:
      assert(0);
      return -1;
  }

  CBS cbs;
  CBS_init(&cbs, buf, buflen);
  int outlen = 0;
  while (CBS_len(&cbs) != 0) {
    const int is_first = CBS_data(&cbs) == buf;
    uint32_t c;
    if (!get_char(&cbs, &c)) {
      OPENSSL_PUT_ERROR(ASN1, get_char_error);
      return -1;
    }
    const int is_last = CBS_len(&cbs) == 0;
    if (flags & ASN1_STRFLGS_UTF8_CONVERT) {
      uint8_t utf8_buf[6];
      CBB utf8_cbb;
      CBB_init_fixed(&utf8_cbb, utf8_buf, sizeof(utf8_buf));
      if (!CBB_add_utf8(&utf8_cbb, c)) {
        OPENSSL_PUT_ERROR(ASN1, ERR_R_INTERNAL_ERROR);
        return 1;
      }
      size_t utf8_len = CBB_len(&utf8_cbb);
      for (size_t i = 0; i < utf8_len; i++) {
        int len = do_esc_char(utf8_buf[i], flags, quotes, out,
                              is_first && i == 0, is_last && i == utf8_len - 1);
        if (len < 0) {
          return -1;
        }
        outlen += len;
      }
    } else {
      int len = do_esc_char(c, flags, quotes, out, is_first, is_last);
      if (len < 0) {
        return -1;
      }
      outlen += len;
    }
  }
  return outlen;
}